

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

void __thiscall QTreeView::updateGeometries(QTreeView *this)

{
  bool bVar1;
  QTreeViewPrivate *this_00;
  int *piVar2;
  QRect *pQVar3;
  QRect *in_RDI;
  long in_FS_OFFSET;
  QTreeViewPrivate *d;
  QRect geometryRect;
  QRect vg;
  int height;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  QRect *obj;
  QRect *r;
  QWidget *this_01;
  int local_20;
  undefined8 local_1c;
  int local_14;
  int local_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  obj = in_RDI;
  this_00 = d_func((QTreeView *)0x8fefea);
  if (this_00->header != (QHeaderView *)0x0) {
    if ((this_00->geometryRecursionBlock & 1U) != 0) goto LAB_008ff1b1;
    this_00->geometryRecursionBlock = true;
    local_c = 0;
    bVar1 = QWidget::isHidden((QWidget *)0x8ff03a);
    if (!bVar1) {
      local_10 = QWidget::minimumHeight
                           ((QWidget *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                           );
      local_1c = (**(code **)(*(long *)&(this_00->header->super_QAbstractItemView).
                                        super_QAbstractScrollArea.super_QFrame.super_QWidget + 0x70)
                 )();
      local_14 = QSize::height((QSize *)0x8ff074);
      piVar2 = qMax<int>(&local_10,&local_14);
      local_c = *piVar2;
      local_20 = QWidget::maximumHeight
                           ((QWidget *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                           );
      piVar2 = qMin<int>(&local_c,&local_20);
      local_c = *piVar2;
    }
    QAbstractScrollArea::setViewportMargins
              ((QAbstractScrollArea *)this_00,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
               in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0);
    pQVar3 = QWidget::geometry((this_00->super_QAbstractItemViewPrivate).
                               super_QAbstractScrollAreaPrivate.viewport);
    r = *(QRect **)pQVar3;
    this_01 = *(QWidget **)&pQVar3->x2;
    in_stack_ffffffffffffffa0 = QRect::left((QRect *)0x8ff12a);
    in_stack_ffffffffffffffa4 = QRect::top((QRect *)0x8ff138);
    in_stack_ffffffffffffffa4 = in_stack_ffffffffffffffa4 - local_c;
    QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    QRect::QRect(in_RDI,in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0,
                 in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
    QWidget::setGeometry(this_01,r);
    QMetaObject::invokeMethod<>((QObject *)obj,(char *)this_00);
    QTreeViewPrivate::updateScrollBars((QTreeViewPrivate *)geometryRect._0_8_);
    this_00->geometryRecursionBlock = false;
  }
  QAbstractItemView::updateGeometries
            ((QAbstractItemView *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
LAB_008ff1b1:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeView::updateGeometries()
{
    Q_D(QTreeView);
    if (d->header) {
        if (d->geometryRecursionBlock)
            return;
        d->geometryRecursionBlock = true;
        int height = 0;
        if (!d->header->isHidden()) {
            height = qMax(d->header->minimumHeight(), d->header->sizeHint().height());
            height = qMin(height, d->header->maximumHeight());
        }
        setViewportMargins(0, height, 0, 0);
        QRect vg = d->viewport->geometry();
        QRect geometryRect(vg.left(), vg.top() - height, vg.width(), height);
        d->header->setGeometry(geometryRect);
        QMetaObject::invokeMethod(d->header, "updateGeometries");
        d->updateScrollBars();
        d->geometryRecursionBlock = false;
    }
    QAbstractItemView::updateGeometries();
}